

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<1280,unsigned_int>
               (hashfunc<unsigned_int> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  undefined4 in_ECX;
  uint in_EDX;
  char *pcVar4;
  uint in_ESI;
  undefined4 in_R8D;
  bool result;
  keytype k;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashes;
  uint32_t *in_stack_ffffffffffffff08;
  undefined2 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff12;
  byte bVar5;
  undefined1 in_stack_ffffffffffffff13;
  int in_stack_ffffffffffffff14;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff30;
  Blob<1280> local_c8;
  undefined1 in_stack_ffffffffffffffdb;
  undefined1 in_stack_ffffffffffffffdc;
  undefined1 in_stack_ffffffffffffffdd;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffe0;
  hashfunc local_8 [8];
  
  uVar1 = in_EDX & 1;
  pcVar4 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar4 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x500,pcVar4,(ulong)in_ESI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x12e59f);
  Blob<1280>::Blob(&local_c8);
  memset(&local_c8,0,0xa0);
  if (uVar1 != 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (in_stack_ffffffffffffff30,
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    in_stack_ffffffffffffff14 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffffd8,0);
    hashfunc<unsigned_int>::operator()
              ((hashfunc<unsigned_int> *)CONCAT44(in_ESI,in_EDX),(void *)CONCAT44(in_ECX,in_R8D),
               in_stack_ffffffffffffff14,
               CONCAT13(in_stack_ffffffffffffff13,
                        CONCAT12(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10)),
               in_stack_ffffffffffffff08);
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<1280>,unsigned_int>
            ((pfHash)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,
             SUB41(in_ESI >> 0x18,0),(Blob<1280> *)CONCAT44(in_ECX,in_R8D),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff14,
                      CONCAT13(in_stack_ffffffffffffff13,
                               CONCAT12(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10))));
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffffd8
                    );
  printf("%d keys\n",sVar3 & 0xffffffff);
  bVar5 = 1;
  bVar2 = TestHashList<unsigned_int>
                    (in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf,
                     (bool)in_stack_ffffffffffffffde,(bool)in_stack_ffffffffffffffdd,
                     (bool)in_stack_ffffffffffffffdc,(bool)in_stack_ffffffffffffffdb);
  bVar5 = bVar2 & bVar5;
  printf("\n");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(in_ESI,in_EDX));
  return (bool)(bVar5 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}